

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  int iVar1;
  value_type pLVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  size_type sVar12;
  reference pvVar13;
  long in_RDI;
  ConvolutionDepthWise *convolution2_7;
  ConvolutionDepthWise *convolution1_7;
  Convolution *convolution2_6;
  ConvolutionDepthWise *convolution1_6;
  ConvolutionDepthWise *convolution2_5;
  Convolution *convolution1_5;
  Convolution *convolution2_4;
  Convolution *convolution1_4;
  ConvolutionDepthWise *convolution_1;
  Convolution *convolution;
  size_t k;
  int split_top_blob_index;
  size_t p;
  bool all_conv;
  Split *split;
  size_t j_1;
  int top_blob_index_1;
  size_t i_1;
  ConvolutionDepthWise *convolution2_3;
  ConvolutionDepthWise *convolution1_3;
  Convolution *convolution2_2;
  ConvolutionDepthWise *convolution1_2;
  ConvolutionDepthWise *convolution2_1;
  Convolution *convolution1_1;
  Convolution *convolution2;
  Convolution *convolution1;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  FILE *pFVar14;
  size_type local_a8;
  ulong local_98;
  size_type local_80;
  size_type local_70;
  size_type local_28;
  size_type local_18;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  for (local_18 = 0; local_18 < sVar6; local_18 = local_18 + 1) {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (bVar4) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18
                );
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar4) goto LAB_00155052;
    }
    else {
LAB_00155052:
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      iVar1 = *pvVar8;
      local_28 = local_18;
LAB_00155098:
      do {
        do {
          local_28 = local_28 + 1;
          if (sVar6 <= local_28) goto LAB_00155186;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar4) goto LAB_00155098;
          }
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
        } while (sVar9 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
      } while (*pvVar8 != iVar1);
LAB_00155186:
      pFVar14 = _stderr;
      if (local_28 != sVar6) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        uVar10 = std::__cxx11::string::c_str();
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_28);
        uVar11 = std::__cxx11::string::c_str();
        fprintf(pFVar14,"fuse_requantize %s %s\n",uVar10,uVar11);
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar4) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_18);
            pLVar2 = *ppLVar7;
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_28);
            if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
               ((*ppLVar7)[1].bottom_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_00155642;
            *(int *)&pLVar2[1].type._M_string_length = (int)pLVar2[1].type._M_string_length + 100;
            ncnn::Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar4) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_18);
            pLVar2 = *ppLVar7;
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_28);
            if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
               ((*ppLVar7)[1].bottom_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x1)) goto LAB_00155642;
            *(int *)&pLVar2[1].type._M_string_length = (int)pLVar2[1].type._M_string_length + 100;
            ncnn::Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar4) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_18);
            pLVar2 = *ppLVar7;
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_28);
            if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1) ||
               ((*ppLVar7)[1].bottom_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_00155642;
            *(int *)((long)&pLVar2[1].type._M_string_length + 4) =
                 *(int *)((long)&pLVar2[1].type._M_string_length + 4) + 100;
            ncnn::Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar4) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_18);
            pLVar2 = *ppLVar7;
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_28);
            if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_finish == (pointer)0x1) &&
               ((*ppLVar7)[1].bottom_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish == (pointer)0x1)) {
              *(int *)((long)&pLVar2[1].type._M_string_length + 4) =
                   *(int *)((long)&pLVar2[1].type._M_string_length + 4) + 100;
              ncnn::Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
            }
          }
        }
      }
    }
LAB_00155642:
  }
  local_70 = 0;
  do {
    if (sVar6 <= local_70) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_70);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (bVar4) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_70
                );
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar4) goto LAB_001556e0;
    }
    else {
LAB_001556e0:
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_70);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      iVar1 = *pvVar8;
      sVar9 = local_70;
      do {
        do {
          do {
            sVar3 = sVar9;
            local_80 = sVar3 + 1;
            if (sVar6 <= local_80) goto LAB_001557e5;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_80);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            sVar9 = local_80;
          } while (bVar4);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_80);
          sVar12 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
          sVar9 = local_80;
        } while (sVar12 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_80);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
        sVar9 = local_80;
      } while (*pvVar8 != iVar1);
LAB_001557e5:
      if (local_80 != sVar6) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_80);
        pLVar2 = *ppLVar7;
        bVar4 = true;
        for (local_98 = 0; sVar9 = std::vector<int,_std::allocator<int>_>::size(&pLVar2->tops),
            local_98 < sVar9; local_98 = local_98 + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,local_98);
          iVar1 = *pvVar8;
          for (local_a8 = sVar3 + 2; local_a8 < sVar6; local_a8 = local_a8 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_a8);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar5) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_a8);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              if (!bVar5) goto LAB_00155912;
            }
            else {
LAB_00155912:
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_a8);
              sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
              if (sVar9 == 1) {
                ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_a8);
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
                if (*pvVar8 == iVar1) break;
              }
            }
          }
          if (local_a8 == sVar6) {
            bVar4 = false;
            break;
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_a8);
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if ((bVar5) &&
             (ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_a8),
             (*ppLVar7)[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) {
            bVar4 = false;
            break;
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_a8);
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if ((bVar5) &&
             (ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_a8),
             (*ppLVar7)[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1)) {
            bVar4 = false;
            break;
          }
        }
        if (bVar4) {
          in_stack_fffffffffffffed0 = *(Mat **)(in_RDI + 0x50);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
          pvVar13 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                               in_stack_fffffffffffffed0,(long)*pvVar8);
          sVar9 = (size_type)pvVar13->consumer;
          pFVar14 = _stderr;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_70);
          uVar10 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          fprintf(pFVar14,"fuse_requantize %s %s\n",uVar10,uVar11);
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_70);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar9);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar4) {
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_70);
              pLVar2 = *ppLVar7;
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),sVar9);
              if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
                 ((*ppLVar7)[1].bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_00155f31;
              *(int *)&pLVar2[1].type._M_string_length = (int)pLVar2[1].type._M_string_length + 100;
              ncnn::Mat::operator=((Mat *)pFVar14,in_stack_fffffffffffffed0);
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_70);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar9);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar4) {
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_70);
              pLVar2 = *ppLVar7;
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),sVar9);
              if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
                 ((*ppLVar7)[1].bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x1)) goto LAB_00155f31;
              *(int *)&pLVar2[1].type._M_string_length = (int)pLVar2[1].type._M_string_length + 100;
              ncnn::Mat::operator=((Mat *)pFVar14,in_stack_fffffffffffffed0);
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_70);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar9);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar4) {
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_70);
              pLVar2 = *ppLVar7;
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),sVar9);
              if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x1) ||
                 ((*ppLVar7)[1].bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_00155f31;
              *(int *)((long)&pLVar2[1].type._M_string_length + 4) =
                   *(int *)((long)&pLVar2[1].type._M_string_length + 4) + 100;
              ncnn::Mat::operator=((Mat *)pFVar14,in_stack_fffffffffffffed0);
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_70);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if (bVar4) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar9);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            if (bVar4) {
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_70);
              pLVar2 = *ppLVar7;
              ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),sVar9);
              if ((pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x1) &&
                 ((*ppLVar7)[1].bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish == (pointer)0x1)) {
                *(int *)((long)&pLVar2[1].type._M_string_length + 4) =
                     *(int *)((long)&pLVar2[1].type._M_string_length + 4) + 100;
                ncnn::Mat::operator=((Mat *)pFVar14,in_stack_fffffffffffffed0);
              }
            }
          }
        }
      }
    }
LAB_00155f31:
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}